

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_dr_flac *
ma_dr_flac_open_memory_with_metadata
          (void *pData,size_t dataSize,ma_dr_flac_meta_proc onMeta,void *pUserData,
          ma_allocation_callbacks *pAllocationCallbacks)

{
  size_t in_RSI;
  ma_uint8 *in_RDI;
  ma_dr_flac_oggbs *oggbs;
  ma_dr_flac *pFlac;
  ma_dr_flac__memory_stream memoryStream;
  void *in_stack_00001220;
  void *in_stack_00001228;
  ma_dr_flac_container in_stack_00001234;
  ma_dr_flac_meta_proc in_stack_00001238;
  ma_dr_flac_seek_proc in_stack_00001240;
  ma_dr_flac_read_proc in_stack_00001248;
  ma_allocation_callbacks *in_stack_000012a0;
  ma_dr_flac *local_8;
  
  local_8 = ma_dr_flac_open_with_metadata_private
                      (in_stack_00001248,in_stack_00001240,in_stack_00001238,in_stack_00001234,
                       in_stack_00001228,in_stack_00001220,in_stack_000012a0);
  if (local_8 == (ma_dr_flac *)0x0) {
    local_8 = (ma_dr_flac *)0x0;
  }
  else {
    (local_8->memoryStream).data = in_RDI;
    (local_8->memoryStream).dataSize = in_RSI;
    (local_8->memoryStream).currentReadPos = 0;
    if (local_8->container == ma_dr_flac_container_ogg) {
      *(ma_dr_flac__memory_stream **)((long)local_8->_oggbs + 0x10) = &local_8->memoryStream;
    }
    else {
      (local_8->bs).pUserData = &local_8->memoryStream;
    }
  }
  return local_8;
}

Assistant:

MA_API ma_dr_flac* ma_dr_flac_open_memory_with_metadata(const void* pData, size_t dataSize, ma_dr_flac_meta_proc onMeta, void* pUserData, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_dr_flac__memory_stream memoryStream;
    ma_dr_flac* pFlac;
    memoryStream.data = (const ma_uint8*)pData;
    memoryStream.dataSize = dataSize;
    memoryStream.currentReadPos = 0;
    pFlac = ma_dr_flac_open_with_metadata_private(ma_dr_flac__on_read_memory, ma_dr_flac__on_seek_memory, onMeta, ma_dr_flac_container_unknown, &memoryStream, pUserData, pAllocationCallbacks);
    if (pFlac == NULL) {
        return NULL;
    }
    pFlac->memoryStream = memoryStream;
#ifndef MA_DR_FLAC_NO_OGG
    if (pFlac->container == ma_dr_flac_container_ogg)
    {
        ma_dr_flac_oggbs* oggbs = (ma_dr_flac_oggbs*)pFlac->_oggbs;
        oggbs->pUserData = &pFlac->memoryStream;
    }
    else
#endif
    {
        pFlac->bs.pUserData = &pFlac->memoryStream;
    }
    return pFlac;
}